

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O0

int __thiscall ncnn::Proposal::load_param(Proposal *this,ParamDict *pd)

{
  int *piVar1;
  int iVar2;
  void **ppvVar3;
  ParamDict *in_RSI;
  long in_RDI;
  float fVar4;
  void *local_d0;
  int *local_c8;
  long *local_b0;
  ParamDict *local_88;
  void **local_78;
  Mat *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa0;
  int base_size;
  void **ppvVar5;
  
  base_size = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_88 = in_RSI;
  iVar2 = ParamDict::get(in_RSI,0,0x10);
  *(int *)(in_RDI + 0xd0) = iVar2;
  iVar2 = ParamDict::get(local_88,1,0x10);
  *(int *)(in_RDI + 0xd4) = iVar2;
  iVar2 = ParamDict::get(local_88,2,6000);
  *(int *)(in_RDI + 0xd8) = iVar2;
  iVar2 = ParamDict::get(local_88,3,300);
  *(int *)(in_RDI + 0xdc) = iVar2;
  fVar4 = ParamDict::get(local_88,4,0.7);
  *(float *)(in_RDI + 0xe0) = fVar4;
  iVar2 = ParamDict::get(local_88,5,0x10);
  *(int *)(in_RDI + 0xe4) = iVar2;
  generate_anchors(base_size,(Mat *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   in_stack_ffffffffffffff90);
  ppvVar3 = (void **)(in_RDI + 0x178);
  ppvVar5 = &local_d0;
  if (ppvVar3 != ppvVar5) {
    if (local_c8 != (int *)0x0) {
      LOCK();
      *local_c8 = *local_c8 + 1;
      UNLOCK();
    }
    if (*(long *)(in_RDI + 0x180) != 0) {
      piVar1 = *(int **)(in_RDI + 0x180);
      LOCK();
      iVar2 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (iVar2 == 1) {
        if (*(long *)(in_RDI + 0x198) == 0) {
          if (*ppvVar3 != (void *)0x0) {
            free(*ppvVar3);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x198) + 0x18))(*(long **)(in_RDI + 0x198),*ppvVar3);
        }
      }
    }
    *ppvVar3 = (void *)0x0;
    *(undefined8 *)(in_RDI + 0x188) = 0;
    *(undefined4 *)(in_RDI + 400) = 0;
    *(undefined4 *)(in_RDI + 0x1a0) = 0;
    *(undefined4 *)(in_RDI + 0x1a4) = 0;
    *(undefined4 *)(in_RDI + 0x1a8) = 0;
    *(undefined4 *)(in_RDI + 0x1ac) = 0;
    *(undefined4 *)(in_RDI + 0x1b0) = 0;
    *(undefined8 *)(in_RDI + 0x1b8) = 0;
    *(undefined8 *)(in_RDI + 0x180) = 0;
    *ppvVar3 = *ppvVar5;
    *(void **)(in_RDI + 0x180) = ppvVar5[1];
    *(void **)(in_RDI + 0x188) = ppvVar5[2];
    *(undefined4 *)(in_RDI + 400) = *(undefined4 *)(ppvVar5 + 3);
    *(void **)(in_RDI + 0x198) = ppvVar5[4];
    *(undefined4 *)(in_RDI + 0x1a0) = *(undefined4 *)(ppvVar5 + 5);
    *(undefined4 *)(in_RDI + 0x1a4) = *(undefined4 *)((long)ppvVar5 + 0x2c);
    *(undefined4 *)(in_RDI + 0x1a8) = *(undefined4 *)(ppvVar5 + 6);
    *(undefined4 *)(in_RDI + 0x1ac) = *(undefined4 *)((long)ppvVar5 + 0x34);
    *(undefined4 *)(in_RDI + 0x1b0) = *(undefined4 *)(ppvVar5 + 7);
    *(void **)(in_RDI + 0x1b8) = ppvVar5[8];
  }
  local_78 = &local_d0;
  if (local_c8 != (int *)0x0) {
    LOCK();
    iVar2 = *local_c8;
    *local_c8 = *local_c8 + -1;
    UNLOCK();
    if (iVar2 == 1) {
      if (local_b0 == (long *)0x0) {
        if (local_d0 != (void *)0x0) {
          free(local_d0);
        }
      }
      else {
        (**(code **)(*local_b0 + 0x18))(local_b0,local_d0);
      }
    }
  }
  return 0;
}

Assistant:

int Proposal::load_param(const ParamDict& pd)
{
    feat_stride = pd.get(0, 16);
    base_size = pd.get(1, 16);
    pre_nms_topN = pd.get(2, 6000);
    after_nms_topN = pd.get(3, 300);
    nms_thresh = pd.get(4, 0.7f);
    min_size = pd.get(5, 16);

    //     Mat ratio;
    //     Mat scale;

    anchors = generate_anchors(base_size, ratios, scales);

    return 0;
}